

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangulateProcess.cpp
# Opt level: O2

bool __thiscall Assimp::TriangulateProcess::TriangulateMesh(TriangulateProcess *this,aiMesh *pMesh)

{
  aiFace *paVar1;
  aiVector2t<float> *p2;
  aiVector2t<float> *p1;
  float fVar2;
  char cVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  ulong *puVar8;
  aiFace *paVar9;
  uint *puVar10;
  uint *puVar11;
  Logger *this_00;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  aiFace *f;
  aiFace *paVar16;
  aiVector3D *paVar17;
  long lVar18;
  aiVector3D *paVar19;
  char *pcVar20;
  aiVector2t<float> *p0;
  long lVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  aiVector3t<float> *v2;
  uint uVar25;
  bool bVar26;
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  aiVector3t<float> aVar30;
  undefined1 local_108 [24];
  unique_ptr<bool[],_std::default_delete<bool[]>_> done;
  aiVector3t<float> local_e0;
  int local_d0;
  uint local_cc;
  aiFace *local_c8;
  aiVector2t<float> *local_c0;
  aiFace *local_b8;
  ulong local_b0;
  aiFace *local_a8;
  aiVector3t<float> local_a0;
  int local_90;
  uint local_8c;
  aiMesh *local_88;
  aiVector3D *local_80;
  aiFace *local_78;
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> temp_verts;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> temp_verts3d;
  
  uVar25 = pMesh->mPrimitiveTypes;
  if (uVar25 == 0) {
    uVar24 = pMesh->mNumFaces;
    uVar12 = (ulong)uVar24;
    bVar26 = false;
    for (lVar18 = 0; uVar12 << 4 != lVar18; lVar18 = lVar18 + 0x10) {
      bVar26 = (bool)(bVar26 | *(int *)((long)&pMesh->mFaces->mNumIndices + lVar18) != 3);
    }
    if (!bVar26) {
      return false;
    }
  }
  else {
    if ((uVar25 & 8) == 0) {
      return false;
    }
    uVar24 = pMesh->mNumFaces;
    uVar12 = (ulong)uVar24;
  }
  uVar23 = 0;
  uVar14 = 0;
  for (lVar18 = 0; uVar12 * 0x10 != lVar18; lVar18 = lVar18 + 0x10) {
    uVar4 = *(uint *)((long)&pMesh->mFaces->mNumIndices + lVar18);
    if (uVar4 < 4) {
      uVar23 = uVar23 + 1;
      uVar15 = uVar14;
    }
    else {
      uVar23 = (uVar23 + uVar4) - 2;
      uVar15 = (ulong)uVar4;
      if (uVar4 < (uint)uVar14) {
        uVar15 = uVar14;
      }
    }
    uVar14 = uVar15;
  }
  if (uVar23 == uVar24) {
    __assert_fail("numOut != pMesh->mNumFaces",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/PostProcessing/TriangulateProcess.cpp"
                  ,0xa2,"bool Assimp::TriangulateProcess::TriangulateMesh(aiMesh *)");
  }
  pMesh->mPrimitiveTypes = uVar25 & 0xfffffff3 | 4;
  uVar12 = (ulong)uVar23;
  puVar8 = (ulong *)operator_new__(uVar12 * 0x10 + 8);
  *puVar8 = uVar12;
  local_b8 = (aiFace *)(puVar8 + 1);
  if (uVar23 != 0) {
    paVar9 = local_b8;
    do {
      paVar9->mNumIndices = 0;
      paVar9->mIndices = (uint *)0x0;
      paVar9 = paVar9 + 1;
    } while (paVar9 != local_b8 + uVar12);
  }
  uVar12 = (ulong)((uint)uVar14 + 2);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::vector
            (&temp_verts3d,uVar12,(allocator_type *)&temp_verts);
  std::vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::vector
            (&temp_verts,uVar12,(allocator_type *)local_108);
  paVar17 = pMesh->mVertices;
  done._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
  super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.super__Head_base<0UL,_bool_*,_false>.
  _M_head_impl = (__uniq_ptr_data<bool,_std::default_delete<bool[]>,_true,_true>)
                 operator_new__(uVar14);
  uVar12 = 0;
  local_88 = pMesh;
  local_80 = paVar17;
  paVar9 = local_b8;
  do {
    paVar16 = pMesh->mFaces;
    if (pMesh->mNumFaces <= uVar12) {
      if (paVar16 != (aiFace *)0x0) {
        if (paVar16[-1].mIndices != (uint *)0x0) {
          lVar18 = (long)paVar16[-1].mIndices << 4;
          do {
            aiFace::~aiFace((aiFace *)((long)&paVar16[-1].mNumIndices + lVar18));
            lVar18 = lVar18 + -0x10;
          } while (lVar18 != 0);
        }
        operator_delete__(&paVar16[-1].mIndices);
      }
      pMesh->mFaces = local_b8;
      pMesh->mNumFaces = (uint)((ulong)((long)paVar9 - (long)local_b8) >> 4);
      std::unique_ptr<bool[],_std::default_delete<bool[]>_>::~unique_ptr(&done);
      std::_Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>::~_Vector_base
                (&temp_verts.
                  super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>);
      std::_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~_Vector_base
                (&temp_verts3d.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>);
      return true;
    }
    local_b0 = uVar12;
    paVar1 = paVar16 + uVar12;
    uVar25 = paVar16[uVar12].mNumIndices;
    uVar14 = (ulong)uVar25;
    if (uVar14 < 4) {
      paVar9->mNumIndices = uVar25;
      paVar9->mIndices = paVar1->mIndices;
      paVar1->mIndices = (uint *)0x0;
      paVar9 = paVar9 + 1;
    }
    else {
      local_a8 = paVar1;
      local_c8 = paVar9;
      if (uVar25 != 4) {
        puVar10 = paVar16[uVar12].mIndices;
        uVar12 = 0;
        if (0 < (int)uVar25) {
          uVar12 = (ulong)uVar25;
        }
        uVar24 = uVar25 - 1;
        puVar11 = puVar10;
        for (lVar18 = 0; uVar12 * 3 != lVar18; lVar18 = lVar18 + 3) {
          uVar23 = *puVar11;
          (&(temp_verts3d.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->z)[lVar18] = paVar17[uVar23].z;
          *(undefined8 *)
           (&(temp_verts3d.
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
              super__Vector_impl_data._M_start)->x + lVar18) = *(undefined8 *)(paVar17 + uVar23);
          puVar11 = puVar11 + 1;
        }
        local_108._0_8_ = 0;
        local_108._8_8_ = local_108._8_8_ & 0xffffffff00000000;
        NewellNormal<3,3,3,float>
                  ((aiVector3t<float> *)local_108,uVar25,
                   &(temp_verts3d.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start)->x,
                   &(temp_verts3d.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start)->y,
                   &(temp_verts3d.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start)->z);
        uVar15 = (ulong)local_108._0_8_ >> 0x20;
        auVar28._8_8_ = 0;
        auVar28._0_8_ = local_108._0_8_;
        auVar29._8_4_ = 0x80000000;
        auVar29._0_8_ = local_108._0_8_ ^ 0x8000000080000000;
        auVar29._12_4_ = 0x80000000;
        auVar29 = maxps(auVar28,auVar29);
        fVar27 = (float)local_108._8_4_;
        if ((float)local_108._8_4_ <= -(float)local_108._8_4_) {
          fVar27 = -(float)local_108._8_4_;
        }
        if (auVar29._0_4_ <= auVar29._4_4_) {
          if (auVar29._4_4_ <= fVar27) goto LAB_0014f032;
          iVar6 = 0;
          iVar13 = 2;
        }
        else {
          if (auVar29._0_4_ <= fVar27) {
LAB_0014f032:
            iVar13 = 0;
            iVar6 = 1;
            fVar27 = (float)local_108._8_4_;
            goto LAB_0014f037;
          }
          iVar13 = 1;
          iVar6 = 2;
          uVar15 = local_108._0_8_;
        }
        fVar27 = (float)uVar15;
LAB_0014f037:
        iVar7 = iVar6;
        if (fVar27 < 0.0) {
          iVar7 = iVar13;
          iVar13 = iVar6;
        }
        for (uVar15 = 0; uVar12 != uVar15; uVar15 = uVar15 + 1) {
          paVar19 = paVar17 + puVar10[uVar15];
          if (iVar13 == 2) {
            paVar19 = (aiVector3D *)&paVar19->z;
          }
          else if (iVar13 == 1) {
            paVar19 = (aiVector3D *)&paVar19->y;
          }
          temp_verts.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar15].x = paVar19->x;
          paVar19 = paVar17 + puVar10[uVar15];
          if (iVar7 == 2) {
            paVar19 = (aiVector3D *)&paVar19->z;
          }
          else if (iVar7 == 1) {
            paVar19 = (aiVector3D *)&paVar19->y;
          }
          temp_verts.super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar15].y = paVar19->x;
          *(undefined1 *)
           ((long)done._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
                  super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
                  super__Head_base<0UL,_bool_*,_false>._M_head_impl + uVar15) = 0;
        }
        uVar23 = 0;
        uVar12 = uVar14;
LAB_0014f0d1:
        paVar16 = local_c8;
        if (3 < (int)uVar12) {
          local_d0 = 0;
          local_78 = paVar9;
          local_90 = (int)uVar12;
          uVar4 = uVar23;
LAB_0014f102:
          while( true ) {
            do {
              uVar22 = uVar4;
              uVar23 = uVar23 + 1;
              if ((int)uVar25 <= (int)uVar23) {
                uVar23 = 0;
              }
              uVar4 = uVar22;
            } while (*(char *)((long)done._M_t.
                                     super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
                                     super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
                                     super__Head_base<0UL,_bool_*,_false>._M_head_impl +
                              (long)(int)uVar23) != '\0');
            if (((int)uVar23 < (int)uVar22) && (bVar26 = local_d0 == 1, local_d0 = 1, bVar26))
            break;
            p2 = temp_verts.
                 super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start + (int)uVar22;
            local_c0 = temp_verts.
                       super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start + (int)uVar24;
            p1 = temp_verts.
                 super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start + (int)uVar23;
            local_8c = uVar24;
            bVar26 = OnLeftSideOfLine2D<aiVector2t<float>>(local_c0,p1,p2);
            local_cc = uVar22;
            uVar4 = uVar23;
            uVar24 = uVar22;
            if (!bVar26) {
              lVar18 = 0;
              p0 = local_c0;
              uVar12 = uVar14;
              do {
                if (uVar12 == 0) goto LAB_0014f1ee;
                fVar27 = *(float *)((long)&(temp_verts.
                                            super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->x + lVar18);
                fVar2 = *(float *)((long)&(temp_verts.
                                           super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->y + lVar18);
                if ((fVar27 != p2->x) || (NAN(fVar27) || NAN(p2->x))) {
LAB_0014f1a5:
                  if ((fVar27 == p1->x) && (!NAN(fVar27) && !NAN(p1->x))) {
                    if ((fVar2 == p1->y) && (!NAN(fVar2) && !NAN(p1->y))) goto LAB_0014f1db;
                  }
                  if ((fVar27 == p0->x) && (!NAN(fVar27) && !NAN(p0->x))) {
                    if ((fVar2 == p0->y) && (!NAN(fVar2) && !NAN(p0->y))) goto LAB_0014f1db;
                  }
                  bVar26 = PointInTriangle2D<aiVector2t<float>>
                                     (p0,p2,p1,(aiVector2t<float> *)
                                               ((long)&(temp_verts.
                                                                                                                
                                                  super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->x +
                                               lVar18));
                  p0 = local_c0;
                  if (bVar26) goto LAB_0014f1e1;
                }
                else if ((fVar2 != p2->y) || (NAN(fVar2) || NAN(p2->y))) goto LAB_0014f1a5;
LAB_0014f1db:
                lVar18 = lVar18 + 8;
                uVar12 = uVar12 - 1;
              } while( true );
            }
          }
          this_00 = DefaultLogger::get();
          paVar9 = local_78;
          paVar17 = local_80;
          pMesh = local_88;
          paVar16 = local_c8;
          Logger::error(this_00,
                        "Failed to triangulate polygon (no ear found). Probably not a simple polygon?"
                       );
          goto LAB_0014f35f;
        }
        if (0 < (int)uVar25) {
          paVar9->mNumIndices = 3;
          puVar11 = paVar9->mIndices;
          if (puVar11 == (uint *)0x0) {
            puVar11 = (uint *)operator_new__(0xc);
            paVar9->mIndices = puVar11;
          }
          lVar18 = -1;
          lVar5 = 2;
          uVar12 = 1;
          do {
            uVar14 = uVar12;
            lVar21 = lVar5;
            pcVar20 = (char *)((long)done._M_t.
                                     super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
                                     super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
                                     super__Head_base<0UL,_bool_*,_false>._M_head_impl + 1 + lVar18)
            ;
            lVar18 = lVar18 + 1;
            lVar5 = lVar21 + 1;
            uVar12 = uVar14 + 1;
          } while (*pcVar20 != '\0');
          *puVar11 = (uint)lVar18;
          do {
            lVar18 = lVar21;
            uVar12 = uVar14;
            uVar14 = uVar12 + 1;
            lVar21 = lVar18 + 1;
          } while (*(char *)((long)done._M_t.
                                   super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
                                   super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
                                   super__Head_base<0UL,_bool_*,_false>._M_head_impl + uVar12) !=
                   '\0');
          paVar9->mIndices[1] = (int)(uVar12 + 1) - 1;
          pcVar20 = (char *)(lVar18 + (long)done._M_t.
                                            super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>
                                            .super__Head_base<0UL,_bool_*,_false>._M_head_impl);
          do {
            uVar25 = (int)uVar12 + 1;
            uVar12 = (ulong)uVar25;
            cVar3 = *pcVar20;
            pcVar20 = pcVar20 + 1;
          } while (cVar3 != '\0');
          paVar9->mIndices[2] = uVar25;
          paVar9 = paVar9 + 1;
        }
LAB_0014f35f:
        for (; paVar1 = local_a8, paVar16 != paVar9; paVar16 = paVar16 + 1) {
          puVar11 = paVar16->mIndices;
          *puVar11 = puVar10[*puVar11];
          puVar11[1] = puVar10[puVar11[1]];
          puVar11[2] = puVar10[puVar11[2]];
        }
        if (local_a8->mIndices != (uint *)0x0) {
          operator_delete__(local_a8->mIndices);
        }
        paVar1->mIndices = (uint *)0x0;
        goto LAB_0014f37c;
      }
      uVar12 = 0;
      do {
        puVar8 = (ulong *)local_a8->mIndices;
        if (uVar12 == 4) {
          uVar25 = 0;
          goto LAB_0014ef99;
        }
        uVar25 = *(uint *)((long)puVar8 + (uVar12 ^ 2) * 4);
        uVar24 = *(uint *)((long)puVar8 + (ulong)((int)uVar12 + 1U & 3) * 4);
        v2 = paVar17 + *(uint *)((long)puVar8 + uVar12 * 4);
        aVar30 = operator-(paVar17 + *(uint *)((long)puVar8 + (ulong)((int)uVar12 - 1U & 3) * 4),v2)
        ;
        local_108._0_8_ = aVar30._0_8_;
        local_108._8_4_ = aVar30.z;
        aVar30 = operator-(paVar17 + uVar25,v2);
        local_e0.z = aVar30.z;
        local_e0._0_8_ = aVar30._0_8_;
        aVar30 = operator-(paVar17 + uVar24,v2);
        paVar9 = local_c8;
        local_a0.z = aVar30.z;
        local_a0._0_8_ = aVar30._0_8_;
        aiVector3t<float>::Normalize((aiVector3t<float> *)local_108);
        aiVector3t<float>::Normalize(&local_e0);
        aiVector3t<float>::Normalize(&local_a0);
        fVar27 = acosf((float)local_108._8_4_ * local_e0.z +
                       (float)local_108._0_4_ * local_e0.x + (float)local_108._4_4_ * local_e0.y);
        local_c0 = (aiVector2t<float> *)CONCAT44(local_c0._4_4_,fVar27);
        fVar27 = acosf(local_a0.z * local_e0.z + local_a0.x * local_e0.x + local_a0.y * local_e0.y);
        uVar12 = uVar12 + 1;
      } while (fVar27 + local_c0._0_4_ <= 3.1415927);
      uVar25 = (int)uVar12 - 1;
      puVar8 = (ulong *)local_a8->mIndices;
LAB_0014ef99:
      paVar16 = local_a8;
      local_108._0_8_ = *puVar8;
      local_108._8_8_ = puVar8[1];
      paVar9->mNumIndices = 3;
      puVar10 = local_a8->mIndices;
      paVar9->mIndices = puVar10;
      *puVar10 = *(uint *)(local_108 + (ulong)uVar25 * 4);
      paVar9->mIndices[1] = *(uint *)(local_108 + (ulong)(uVar25 + 1 & 3) * 4);
      paVar9->mIndices[2] = *(uint *)(local_108 + (ulong)(uVar25 ^ 2) * 4);
      paVar9[1].mNumIndices = 3;
      puVar10 = (uint *)operator_new__(0xc);
      paVar9[1].mIndices = puVar10;
      *puVar10 = *(uint *)(local_108 + (ulong)uVar25 * 4);
      paVar9[1].mIndices[1] = *(uint *)(local_108 + (ulong)(uVar25 ^ 2) * 4);
      paVar9[1].mIndices[2] = *(uint *)(local_108 + (ulong)(uVar25 - 1 & 3) * 4);
      paVar16->mIndices = (uint *)0x0;
      paVar9 = paVar9 + 2;
    }
LAB_0014f37c:
    uVar12 = local_b0 + 1;
  } while( true );
LAB_0014f1e1:
  uVar24 = local_cc;
  if ((int)uVar12 == 0) goto LAB_0014f1ee;
  goto LAB_0014f102;
LAB_0014f1ee:
  paVar16 = local_78;
  paVar17 = local_80;
  uVar24 = local_8c;
  uVar4 = local_cc;
  local_78->mNumIndices = 3;
  puVar11 = local_78->mIndices;
  if (puVar11 == (uint *)0x0) {
    puVar11 = (uint *)operator_new__(0xc);
    paVar16->mIndices = puVar11;
  }
  *puVar11 = uVar24;
  paVar16->mIndices[1] = uVar4;
  paVar9 = paVar16 + 1;
  paVar16->mIndices[2] = uVar23;
  *(undefined1 *)
   ((long)done._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
          super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
          super__Head_base<0UL,_bool_*,_false>._M_head_impl + (long)(int)uVar22) = 1;
  uVar12 = (ulong)(local_90 - 1);
  pMesh = local_88;
  goto LAB_0014f0d1;
}

Assistant:

bool TriangulateProcess::TriangulateMesh( aiMesh* pMesh)
{
    // Now we have aiMesh::mPrimitiveTypes, so this is only here for test cases
    if (!pMesh->mPrimitiveTypes)    {
        bool bNeed = false;

        for( unsigned int a = 0; a < pMesh->mNumFaces; a++) {
            const aiFace& face = pMesh->mFaces[a];

            if( face.mNumIndices != 3)  {
                bNeed = true;
            }
        }
        if (!bNeed)
            return false;
    }
    else if (!(pMesh->mPrimitiveTypes & aiPrimitiveType_POLYGON)) {
        return false;
    }

    // Find out how many output faces we'll get
    unsigned int numOut = 0, max_out = 0;
    bool get_normals = true;
    for( unsigned int a = 0; a < pMesh->mNumFaces; a++) {
        aiFace& face = pMesh->mFaces[a];
        if (face.mNumIndices <= 4) {
            get_normals = false;
        }
        if( face.mNumIndices <= 3) {
            numOut++;

        }
        else {
            numOut += face.mNumIndices-2;
            max_out = std::max(max_out,face.mNumIndices);
        }
    }

    // Just another check whether aiMesh::mPrimitiveTypes is correct
    ai_assert(numOut != pMesh->mNumFaces);

    aiVector3D* nor_out = NULL;

    // if we don't have normals yet, but expect them to be a cheap side
    // product of triangulation anyway, allocate storage for them.
    if (!pMesh->mNormals && get_normals) {
        // XXX need a mechanism to inform the GenVertexNormals process to treat these normals as preprocessed per-face normals
    //  nor_out = pMesh->mNormals = new aiVector3D[pMesh->mNumVertices];
    }

    // the output mesh will contain triangles, but no polys anymore
    pMesh->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
    pMesh->mPrimitiveTypes &= ~aiPrimitiveType_POLYGON;

    aiFace* out = new aiFace[numOut](), *curOut = out;
    std::vector<aiVector3D> temp_verts3d(max_out+2); /* temporary storage for vertices */
    std::vector<aiVector2D> temp_verts(max_out+2);

    // Apply vertex colors to represent the face winding?
#ifdef AI_BUILD_TRIANGULATE_COLOR_FACE_WINDING
    if (!pMesh->mColors[0])
        pMesh->mColors[0] = new aiColor4D[pMesh->mNumVertices];
    else
        new(pMesh->mColors[0]) aiColor4D[pMesh->mNumVertices];

    aiColor4D* clr = pMesh->mColors[0];
#endif

#ifdef AI_BUILD_TRIANGULATE_DEBUG_POLYS
    FILE* fout = fopen(POLY_OUTPUT_FILE,"a");
#endif

    const aiVector3D* verts = pMesh->mVertices;

    // use std::unique_ptr to avoid slow std::vector<bool> specialiations
    std::unique_ptr<bool[]> done(new bool[max_out]);
    for( unsigned int a = 0; a < pMesh->mNumFaces; a++) {
        aiFace& face = pMesh->mFaces[a];

        unsigned int* idx = face.mIndices;
        int num = (int)face.mNumIndices, ear = 0, tmp, prev = num-1, next = 0, max = num;

        // Apply vertex colors to represent the face winding?
#ifdef AI_BUILD_TRIANGULATE_COLOR_FACE_WINDING
        for (unsigned int i = 0; i < face.mNumIndices; ++i) {
            aiColor4D& c = clr[idx[i]];
            c.r = (i+1) / (float)max;
            c.b = 1.f - c.r;
        }
#endif

        aiFace* const last_face = curOut;

        // if it's a simple point,line or triangle: just copy it
        if( face.mNumIndices <= 3)
        {
            aiFace& nface = *curOut++;
            nface.mNumIndices = face.mNumIndices;
            nface.mIndices    = face.mIndices;

            face.mIndices = NULL;
            continue;
        }
        // optimized code for quadrilaterals
        else if ( face.mNumIndices == 4) {

            // quads can have at maximum one concave vertex. Determine
            // this vertex (if it exists) and start tri-fanning from
            // it.
            unsigned int start_vertex = 0;
            for (unsigned int i = 0; i < 4; ++i) {
                const aiVector3D& v0 = verts[face.mIndices[(i+3) % 4]];
                const aiVector3D& v1 = verts[face.mIndices[(i+2) % 4]];
                const aiVector3D& v2 = verts[face.mIndices[(i+1) % 4]];

                const aiVector3D& v = verts[face.mIndices[i]];

                aiVector3D left = (v0-v);
                aiVector3D diag = (v1-v);
                aiVector3D right = (v2-v);

                left.Normalize();
                diag.Normalize();
                right.Normalize();

                const float angle = std::acos(left*diag) + std::acos(right*diag);
                if (angle > AI_MATH_PI_F) {
                    // this is the concave point
                    start_vertex = i;
                    break;
                }
            }

            const unsigned int temp[] = {face.mIndices[0], face.mIndices[1], face.mIndices[2], face.mIndices[3]};

            aiFace& nface = *curOut++;
            nface.mNumIndices = 3;
            nface.mIndices = face.mIndices;

            nface.mIndices[0] = temp[start_vertex];
            nface.mIndices[1] = temp[(start_vertex + 1) % 4];
            nface.mIndices[2] = temp[(start_vertex + 2) % 4];

            aiFace& sface = *curOut++;
            sface.mNumIndices = 3;
            sface.mIndices = new unsigned int[3];

            sface.mIndices[0] = temp[start_vertex];
            sface.mIndices[1] = temp[(start_vertex + 2) % 4];
            sface.mIndices[2] = temp[(start_vertex + 3) % 4];

            // prevent double deletion of the indices field
            face.mIndices = NULL;
            continue;
        }
        else
        {
            // A polygon with more than 3 vertices can be either concave or convex.
            // Usually everything we're getting is convex and we could easily
            // triangulate by tri-fanning. However, LightWave is probably the only
            // modeling suite to make extensive use of highly concave, monster polygons ...
            // so we need to apply the full 'ear cutting' algorithm to get it right.

            // RERQUIREMENT: polygon is expected to be simple and *nearly* planar.
            // We project it onto a plane to get a 2d triangle.

            // Collect all vertices of of the polygon.
           for (tmp = 0; tmp < max; ++tmp) {
                temp_verts3d[tmp] = verts[idx[tmp]];
            }

            // Get newell normal of the polygon. Store it for future use if it's a polygon-only mesh
            aiVector3D n;
            NewellNormal<3,3,3>(n,max,&temp_verts3d.front().x,&temp_verts3d.front().y,&temp_verts3d.front().z);
            if (nor_out) {
                 for (tmp = 0; tmp < max; ++tmp)
                     nor_out[idx[tmp]] = n;
            }

            // Select largest normal coordinate to ignore for projection
            const float ax = (n.x>0 ? n.x : -n.x);
            const float ay = (n.y>0 ? n.y : -n.y);
            const float az = (n.z>0 ? n.z : -n.z);

            unsigned int ac = 0, bc = 1; /* no z coord. projection to xy */
            float inv = n.z;
            if (ax > ay) {
                if (ax > az) { /* no x coord. projection to yz */
                    ac = 1; bc = 2;
                    inv = n.x;
                }
            }
            else if (ay > az) { /* no y coord. projection to zy */
                ac = 2; bc = 0;
                inv = n.y;
            }

            // Swap projection axes to take the negated projection vector into account
            if (inv < 0.f) {
                std::swap(ac,bc);
            }

            for (tmp =0; tmp < max; ++tmp) {
                temp_verts[tmp].x = verts[idx[tmp]][ac];
                temp_verts[tmp].y = verts[idx[tmp]][bc];
                done[tmp] = false;
            }

#ifdef AI_BUILD_TRIANGULATE_DEBUG_POLYS
            // plot the plane onto which we mapped the polygon to a 2D ASCII pic
            aiVector2D bmin,bmax;
            ArrayBounds(&temp_verts[0],max,bmin,bmax);

            char grid[POLY_GRID_Y][POLY_GRID_X+POLY_GRID_XPAD];
            std::fill_n((char*)grid,POLY_GRID_Y*(POLY_GRID_X+POLY_GRID_XPAD),' ');

            for (int i =0; i < max; ++i) {
                const aiVector2D& v = (temp_verts[i] - bmin) / (bmax-bmin);
                const size_t x = static_cast<size_t>(v.x*(POLY_GRID_X-1)), y = static_cast<size_t>(v.y*(POLY_GRID_Y-1));
                char* loc = grid[y]+x;
                if (grid[y][x] != ' ') {
                    for(;*loc != ' '; ++loc);
                    *loc++ = '_';
                }
                *(loc+::ai_snprintf(loc, POLY_GRID_XPAD,"%i",i)) = ' ';
            }


            for(size_t y = 0; y < POLY_GRID_Y; ++y) {
                grid[y][POLY_GRID_X+POLY_GRID_XPAD-1] = '\0';
                fprintf(fout,"%s\n",grid[y]);
            }

            fprintf(fout,"\ntriangulation sequence: ");
#endif

            //
            // FIXME: currently this is the slow O(kn) variant with a worst case
            // complexity of O(n^2) (I think). Can be done in O(n).
            while (num > 3) {

                // Find the next ear of the polygon
                int num_found = 0;
                for (ear = next;;prev = ear,ear = next) {

                    // break after we looped two times without a positive match
                    for (next=ear+1;done[(next>=max?next=0:next)];++next);
                    if (next < ear) {
                        if (++num_found == 2) {
                            break;
                        }
                    }
                    const aiVector2D* pnt1 = &temp_verts[ear],
                        *pnt0 = &temp_verts[prev],
                        *pnt2 = &temp_verts[next];

                    // Must be a convex point. Assuming ccw winding, it must be on the right of the line between p-1 and p+1.
                    if (OnLeftSideOfLine2D(*pnt0,*pnt2,*pnt1)) {
                        continue;
                    }

                    // and no other point may be contained in this triangle
                    for ( tmp = 0; tmp < max; ++tmp) {

                        // We need to compare the actual values because it's possible that multiple indexes in
                        // the polygon are referring to the same position. concave_polygon.obj is a sample
                        //
                        // FIXME: Use 'epsiloned' comparisons instead? Due to numeric inaccuracies in
                        // PointInTriangle() I'm guessing that it's actually possible to construct
                        // input data that would cause us to end up with no ears. The problem is,
                        // which epsilon? If we chose a too large value, we'd get wrong results
                        const aiVector2D& vtmp = temp_verts[tmp];
                        if ( vtmp != *pnt1 && vtmp != *pnt2 && vtmp != *pnt0 && PointInTriangle2D(*pnt0,*pnt1,*pnt2,vtmp)) {
                            break;
                        }
                    }
                    if (tmp != max) {
                        continue;
                    }

                    // this vertex is an ear
                    break;
                }
                if (num_found == 2) {

                    // Due to the 'two ear theorem', every simple polygon with more than three points must
                    // have 2 'ears'. Here's definitely something wrong ... but we don't give up yet.
                    //

                    // Instead we're continuing with the standard tri-fanning algorithm which we'd
                    // use if we had only convex polygons. That's life.
                    ASSIMP_LOG_ERROR("Failed to triangulate polygon (no ear found). Probably not a simple polygon?");

#ifdef AI_BUILD_TRIANGULATE_DEBUG_POLYS
                    fprintf(fout,"critical error here, no ear found! ");
#endif
                    num = 0;
                    break;

                    curOut -= (max-num); /* undo all previous work */
                    for (tmp = 0; tmp < max-2; ++tmp) {
                        aiFace& nface = *curOut++;

                        nface.mNumIndices = 3;
                        if (!nface.mIndices)
                            nface.mIndices = new unsigned int[3];

                        nface.mIndices[0] = 0;
                        nface.mIndices[1] = tmp+1;
                        nface.mIndices[2] = tmp+2;

                    }
                    num = 0;
                    break;
                }

                aiFace& nface = *curOut++;
                nface.mNumIndices = 3;

                if (!nface.mIndices) {
                    nface.mIndices = new unsigned int[3];
                }

                // setup indices for the new triangle ...
                nface.mIndices[0] = prev;
                nface.mIndices[1] = ear;
                nface.mIndices[2] = next;

                // exclude the ear from most further processing
                done[ear] = true;
                --num;
            }
            if (num > 0) {
                // We have three indices forming the last 'ear' remaining. Collect them.
                aiFace& nface = *curOut++;
                nface.mNumIndices = 3;
                if (!nface.mIndices) {
                    nface.mIndices = new unsigned int[3];
                }

                for (tmp = 0; done[tmp]; ++tmp);
                nface.mIndices[0] = tmp;

                for (++tmp; done[tmp]; ++tmp);
                nface.mIndices[1] = tmp;

                for (++tmp; done[tmp]; ++tmp);
                nface.mIndices[2] = tmp;

            }
        }

#ifdef AI_BUILD_TRIANGULATE_DEBUG_POLYS

        for(aiFace* f = last_face; f != curOut; ++f) {
            unsigned int* i = f->mIndices;
            fprintf(fout," (%i %i %i)",i[0],i[1],i[2]);
        }

        fprintf(fout,"\n*********************************************************************\n");
        fflush(fout);

#endif

        for(aiFace* f = last_face; f != curOut; ) {
            unsigned int* i = f->mIndices;

            //  drop dumb 0-area triangles - deactivated for now:
            //FindDegenerates post processing step can do the same thing
            //if (std::fabs(GetArea2D(temp_verts[i[0]],temp_verts[i[1]],temp_verts[i[2]])) < 1e-5f) {
            //    ASSIMP_LOG_DEBUG("Dropping triangle with area 0");
            //    --curOut;

            //    delete[] f->mIndices;
            //    f->mIndices = nullptr;

            //    for(aiFace* ff = f; ff != curOut; ++ff) {
            //        ff->mNumIndices = (ff+1)->mNumIndices;
            //        ff->mIndices = (ff+1)->mIndices;
            //        (ff+1)->mIndices = nullptr;
            //    }
            //    continue;
            //}

            i[0] = idx[i[0]];
            i[1] = idx[i[1]];
            i[2] = idx[i[2]];
            ++f;
        }

        delete[] face.mIndices;
        face.mIndices = NULL;
    }

#ifdef AI_BUILD_TRIANGULATE_DEBUG_POLYS
    fclose(fout);
#endif

    // kill the old faces
    delete [] pMesh->mFaces;

    // ... and store the new ones
    pMesh->mFaces    = out;
    pMesh->mNumFaces = (unsigned int)(curOut-out); /* not necessarily equal to numOut */
    return true;
}